

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O1

bool __thiscall DSaveMenu::MenuEvent(DSaveMenu *this,int mkey,bool fromcontroller)

{
  char *__dest;
  int iVar1;
  bool bVar2;
  long lVar3;
  DTextEnterMenu *this_00;
  
  bVar2 = DLoadSaveMenu::MenuEvent(&this->super_DLoadSaveMenu,mkey,fromcontroller);
  if (!bVar2) {
    iVar1 = (this->super_DLoadSaveMenu).Selected;
    lVar3 = (long)iVar1;
    if (lVar3 != -1) {
      if (mkey == 0xb) {
        (this->super_DLoadSaveMenu).mEntering = false;
      }
      else if (mkey == 10) {
        (this->super_DLoadSaveMenu).mEntering = false;
        DoSave(this,DLoadSaveMenu::SaveGames.Array[lVar3]);
      }
      else if (mkey == 6) {
        __dest = (this->super_DLoadSaveMenu).savegamestring;
        if (iVar1 == 0) {
          *__dest = '\0';
        }
        else {
          strcpy(__dest,DLoadSaveMenu::SaveGames.Array[lVar3]->Title);
        }
        this_00 = (DTextEnterMenu *)
                  M_Malloc_Dbg(0x58,
                               "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                               ,0x1f7);
        DTextEnterMenu::DTextEnterMenu(this_00,(DMenu *)this,__dest,0x18,1,fromcontroller,false);
        M_ActivateMenu((DMenu *)this_00);
        (this->super_DLoadSaveMenu).mEntering = true;
      }
    }
  }
  return bVar2;
}

Assistant:

bool DSaveMenu::MenuEvent (int mkey, bool fromcontroller)
{
	if (Super::MenuEvent(mkey, fromcontroller)) 
	{
		return true;
	}
	if (Selected == -1)
	{
		return false;
	}

	if (mkey == MKEY_Enter)
	{
		if (Selected != 0)
		{
			strcpy (savegamestring, SaveGames[Selected]->Title);
		}
		else
		{
			savegamestring[0] = 0;
		}
		DMenu *input = new DTextEnterMenu(this, savegamestring, SAVESTRINGSIZE, 1, fromcontroller);
		M_ActivateMenu(input);
		mEntering = true;
	}
	else if (mkey == MKEY_Input)
	{
		mEntering = false;
		DoSave(SaveGames[Selected]);
	}
	else if (mkey == MKEY_Abort)
	{
		mEntering = false;
	}
	return false;
}